

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O2

int asn1_marshal_bit_string(CBB *out,ASN1_BIT_STRING *in,CBS_ASN1_TAG tag)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  CBS_ASN1_TAG tag_00;
  uint uVar4;
  uint8_t *ptr;
  CBB child;
  
  uVar1 = i2c_ASN1_BIT_STRING((ASN1_BIT_STRING *)in,(uchar **)0x0);
  uVar4 = 0;
  if (0 < (int)uVar1) {
    tag_00 = 3;
    if (tag != 0) {
      tag_00 = tag;
    }
    iVar2 = CBB_add_asn1(out,&child,tag_00);
    uVar4 = 0;
    if (iVar2 != 0) {
      iVar2 = CBB_add_space(&child,&ptr,(ulong)uVar1);
      if (iVar2 != 0) {
        uVar3 = i2c_ASN1_BIT_STRING((ASN1_BIT_STRING *)in,&ptr);
        uVar4 = 0;
        if (uVar3 == uVar1) {
          iVar2 = CBB_flush(out);
          uVar4 = (uint)(iVar2 != 0);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int asn1_marshal_bit_string(CBB *out, const ASN1_BIT_STRING *in,
                            CBS_ASN1_TAG tag) {
  int len = i2c_ASN1_BIT_STRING(in, nullptr);
  if (len <= 0) {
    return 0;
  }
  tag = tag == 0 ? CBS_ASN1_BITSTRING : tag;
  CBB child;
  uint8_t *ptr;
  return CBB_add_asn1(out, &child, tag) &&                         //
         CBB_add_space(&child, &ptr, static_cast<size_t>(len)) &&  //
         i2c_ASN1_BIT_STRING(in, &ptr) == len &&                   //
         CBB_flush(out);
}